

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

Element * ftxui::operator|=(Element *e,Decorator *d)

{
  function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> local_58;
  shared_ptr<ftxui::Node> local_38;
  shared_ptr<ftxui::Node> local_28;
  Decorator *local_18;
  Decorator *d_local;
  Element *e_local;
  
  local_18 = d;
  d_local = (Decorator *)e;
  std::shared_ptr<ftxui::Node>::shared_ptr(&local_38,e);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::function(&local_58,d);
  operator|((ftxui *)&local_28,&local_38,&local_58);
  std::shared_ptr<ftxui::Node>::operator=((shared_ptr<ftxui::Node> *)d_local,&local_28);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_28);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function(&local_58);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_38);
  return (Element *)d_local;
}

Assistant:

Element& operator|=(Element& e, Decorator d) {
  e = e | std::move(d);
  return e;
}